

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(void)

{
  size_t sVar1;
  char local_54 [8];
  char ch_str [12];
  char buffer [32];
  int local_20;
  char acStack_1a [2];
  int i;
  char cStack_14;
  char cStack_13;
  char string [14];
  
  string[6] = '\0';
  string[7] = '\0';
  string[8] = '\0';
  string[9] = '\0';
  acStack_1a[0] = 'H';
  acStack_1a[1] = 'e';
  i._0_1_ = 'l';
  i._1_1_ = 'l';
  i._2_1_ = 'o';
  i._3_1_ = ' ';
  cStack_14 = 'W';
  cStack_13 = 'o';
  builtin_strncpy(string,"rld!\n",6);
  local_20 = 0;
  while( true ) {
    sVar1 = strlen(acStack_1a);
    if (sVar1 <= (ulong)(long)local_20) break;
    printf("%c ",(ulong)(uint)(int)acStack_1a[local_20]);
    local_20 = local_20 + 1;
  }
  printf("%s\n",acStack_1a);
  printf("Enter a string: ");
  __isoc99_scanf("%[^\n]",ch_str + 4);
  printf("You entered: %s\n",ch_str + 4);
  builtin_strncpy(local_54,"Hello Ag",8);
  builtin_strncpy(ch_str,"ain",4);
  printf("%s\n",local_54);
  return 0;
}

Assistant:

int main() {

    char string[] = "Hello World!\n";

    for (int i = 0; i < strlen(string); i++) {
        printf("%c ", string[i]);
    }

    printf("%s\n", string);

    char buffer[32];

    printf("Enter a string: ");
    scanf("%[^\n]", buffer);

    printf("You entered: %s\n", buffer);

    char ch_str[] = {'H','e','l','l','o',0x20,'A','g','a','i','n','\0'};

    printf("%s\n", ch_str);

    return 0;
}